

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ini_file.cxx
# Opt level: O1

bool __thiscall xray_re::xr_ini_file::parse(xr_ini_file *this,char *p,char *end,char *path)

{
  char cVar1;
  ini_section **ppiVar2;
  pointer ppiVar3;
  ulong uVar4;
  _Alloc_hider __s2;
  int iVar5;
  int iVar6;
  void *pvVar7;
  ini_item *piVar8;
  ini_section *piVar9;
  size_t sVar10;
  bool bVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  char *buf;
  ulong uVar13;
  char *pcVar14;
  const_iterator __position;
  pointer ppiVar15;
  bool bVar16;
  const_iterator __position_00;
  ini_section *section;
  ini_item *item;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string name;
  string extension;
  string fname;
  string folder;
  char temp [256];
  char *local_218;
  uint local_20c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_208;
  value_type local_200;
  char *local_1f8;
  xr_ini_file *local_1f0;
  ini_item *local_1e8;
  long *local_1e0 [2];
  long local_1d0 [2];
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  ini_item **local_140;
  char local_138;
  undefined7 uStack_137;
  
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  local_160._M_string_length = 0;
  local_160.field_2._M_local_buf[0] = '\0';
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  local_180._M_string_length = 0;
  local_180.field_2._M_local_buf[0] = '\0';
  local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
  local_1a0._M_string_length = 0;
  local_1a0.field_2._M_local_buf[0] = '\0';
  local_218 = p;
  local_1f0 = this;
  xr_file_system::split_path(path,&local_160,&local_180,&local_1a0);
  std::__cxx11::string::_M_append((char *)&local_180,(ulong)local_1a0._M_dataplus._M_p);
  local_208 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180._M_dataplus._M_p;
  local_200 = (ini_section *)0x0;
  paVar12 = &local_1c0.field_2;
  local_1c0._M_string_length = 0;
  local_1c0.field_2._M_local_buf[0] = '\0';
  local_1c0._M_dataplus._M_p = (pointer)paVar12;
  iVar5 = skip_blank(&local_218,end);
  buf = (char *)CONCAT71((int7)((ulong)paVar12 >> 8),iVar5 != 0x101);
  if (iVar5 == 0x101 || local_218 < end) {
    local_20c = 1;
    local_1f8 = end;
    do {
      pcVar14 = local_218;
      if (iVar5 == 0x5b) {
        local_218 = local_218 + 1;
        iVar5 = read_name(&local_218,end,(size_t)&local_138,buf);
        pcVar14 = "bad section header at %s:%u";
        if ((iVar5 == 0x5d) && (pcVar14 = "bad section header at %s:%u", local_138 != '\0')) {
          __position_00._M_current =
               (local_1f0->m_sections).
               super__Vector_base<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
          ppiVar2 = (local_1f0->m_sections).
                    super__Vector_base<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          uVar13 = (long)ppiVar2 - (long)__position_00._M_current >> 3;
          while (uVar4 = uVar13, 0 < (long)uVar4) {
            uVar13 = uVar4 >> 1;
            iVar5 = strcasecmp((__position_00._M_current[uVar13]->name)._M_dataplus._M_p,&local_138)
            ;
            if (iVar5 < 0) {
              __position_00._M_current = __position_00._M_current + uVar13 + 1;
              uVar13 = ~uVar13 + uVar4;
            }
          }
          if ((__position_00._M_current == ppiVar2) ||
             (iVar5 = strcasecmp(((*__position_00._M_current)->name)._M_dataplus._M_p,&local_138),
             iVar5 != 0)) {
            piVar9 = (ini_section *)operator_new(0x38);
            (piVar9->name)._M_dataplus._M_p = (pointer)&(piVar9->name).field_2;
            sVar10 = strlen(&local_138);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)piVar9,&local_138,&local_138 + sVar10);
            (piVar9->items).
            super__Vector_base<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (piVar9->items).
            super__Vector_base<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (piVar9->items).
            super__Vector_base<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_200 = piVar9;
            std::
            vector<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
            ::insert(&local_1f0->m_sections,__position_00,&local_200);
            local_218 = local_218 + 1;
            iVar5 = skip_blank(&local_218,end);
            bVar11 = true;
            if (iVar5 == 0x3a) {
              do {
                local_218 = local_218 + 1;
                iVar5 = read_name(&local_218,end,(size_t)&local_138,buf);
                ppiVar15 = (local_1f0->m_sections).
                           super__Vector_base<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                ppiVar3 = (local_1f0->m_sections).
                          super__Vector_base<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                uVar13 = (long)ppiVar3 - (long)ppiVar15 >> 3;
                while (uVar4 = uVar13, 0 < (long)uVar4) {
                  uVar13 = uVar4 >> 1;
                  iVar6 = strcasecmp((ppiVar15[uVar13]->name)._M_dataplus._M_p,&local_138);
                  if (iVar6 < 0) {
                    ppiVar15 = ppiVar15 + uVar13 + 1;
                    uVar13 = ~uVar13 + uVar4;
                  }
                }
                if (ppiVar15 == ppiVar3) {
LAB_0016412e:
                  buf = (char *)(ulong)local_20c;
                  msg("bad section reference \'%s\' at %s:%u",&local_138,local_208,buf);
                  bVar11 = true;
                  end = local_1f8;
                  goto LAB_0016417b;
                }
                piVar9 = *ppiVar15;
                iVar6 = strcasecmp((piVar9->name)._M_dataplus._M_p,&local_138);
                if (iVar6 != 0) goto LAB_0016412e;
                ini_section::merge(local_200,piVar9);
                end = local_1f8;
              } while (iVar5 == 0x2c);
              bVar11 = true;
            }
          }
          else {
            iVar5 = 0x5d;
            bVar11 = false;
            buf = (char *)(ulong)local_20c;
            msg("duplicate section %s at %s:%u",&local_138,local_208,buf);
          }
LAB_0016417b:
          if (bVar11) goto LAB_001641cb;
LAB_00164180:
          bVar11 = false;
          goto LAB_00164223;
        }
LAB_001640e9:
        bVar11 = false;
        msg(pcVar14,local_208,(ulong)local_20c);
        bVar16 = false;
      }
      else {
        if ((iVar5 == 0xd) || (iVar5 == 10)) {
          __assert_fail("c != \'\\n\' && c != \'\\r\'",
                        "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ini_file.cxx"
                        ,0x114,
                        "bool xray_re::xr_ini_file::parse(const char *, const char *, const char *)"
                       );
        }
        if ((iVar5 - 0x102U < 0xfffffffe) &&
           ((iVar6 = isalnum(iVar5), iVar6 != 0 ||
            (pvVar7 = memchr("@$_-?:.\\",iVar5,9), pvVar7 != (void *)0x0)))) {
          if (local_200 == (ini_section *)0x0) {
            msg("item without section at %s:%u",local_208,(ulong)local_20c);
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ini_file.cxx"
                          ,0x136,
                          "bool xray_re::xr_ini_file::parse(const char *, const char *, const char *)"
                         );
          }
          buf = (char *)0x0;
          iVar5 = read_item(&local_218,end,&local_1c0,true);
          __s2._M_p = local_1c0._M_dataplus._M_p;
          __position._M_current =
               (local_200->items).
               super__Vector_base<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_140 = (local_200->items).
                      super__Vector_base<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          uVar13 = (long)local_140 - (long)__position._M_current >> 3;
          while (uVar4 = uVar13, 0 < (long)uVar4) {
            uVar13 = uVar4 >> 1;
            iVar6 = strcasecmp((__position._M_current[uVar13]->name)._M_dataplus._M_p,__s2._M_p);
            if (iVar6 < 0) {
              __position._M_current = __position._M_current + uVar13 + 1;
              uVar13 = ~uVar13 + uVar4;
            }
          }
          if (__position._M_current == local_140) {
LAB_00163ddd:
            piVar8 = (ini_item *)operator_new(0x40);
            end = local_1f8;
            (piVar8->name)._M_dataplus._M_p = (pointer)&(piVar8->name).field_2;
            buf = (char *)0x0;
            (piVar8->name)._M_string_length = 0;
            (piVar8->name).field_2._M_local_buf[0] = '\0';
            (piVar8->value)._M_dataplus._M_p = (pointer)&(piVar8->value).field_2;
            (piVar8->value)._M_string_length = 0;
            (piVar8->value).field_2._M_local_buf[0] = '\0';
            std::__cxx11::string::swap((string *)piVar8);
            local_1e8 = piVar8;
            std::
            vector<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>
            ::insert(&local_200->items,__position,&local_1e8);
            piVar8 = local_1e8;
          }
          else {
            piVar8 = *__position._M_current;
            iVar6 = strcasecmp((piVar8->name)._M_dataplus._M_p,__s2._M_p);
            end = local_1f8;
            if (iVar6 != 0) goto LAB_00163ddd;
          }
          local_1e8 = piVar8;
          if (iVar5 == 0x3d) {
            local_218 = local_218 + 1;
            buf = (char *)0x0;
            iVar5 = read_item(&local_218,end,&local_1e8->value,false);
          }
          else {
            (local_1e8->value)._M_string_length = 0;
            *(local_1e8->value)._M_dataplus._M_p = '\0';
          }
        }
        else if (iVar5 == 0x23) {
          local_218 = pcVar14 + 1;
          iVar5 = read_name(&local_218,end,(size_t)&local_138,buf);
          if ((iVar5 != 0x22) || (CONCAT71(uStack_137,local_138) != 0x6564756c636e69)) {
            bVar11 = false;
            buf = (char *)(ulong)local_20c;
            msg("bad directive %s at %s:%u",&local_138,local_208,buf);
            bVar16 = false;
            goto LAB_00164226;
          }
          local_218 = local_218 + 1;
          iVar5 = read_name(&local_218,end,(size_t)&local_138,buf);
          pcVar14 = "bad include at %s:%u";
          if ((iVar5 != 0x22) || (pcVar14 = "bad include at %s:%u", local_138 == '\0'))
          goto LAB_001640e9;
          local_1e0[0] = local_1d0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1e0,local_160._M_dataplus._M_p,
                     local_160._M_dataplus._M_p + local_160._M_string_length);
          std::__cxx11::string::append((char *)local_1e0);
          bVar11 = load_include(local_1f0,(char *)local_1e0[0]);
          if (local_1e0[0] != local_1d0) {
            operator_delete(local_1e0[0],local_1d0[0] + 1);
          }
          if (!bVar11) goto LAB_00164180;
          local_218 = local_218 + 1;
          iVar5 = skip_blank(&local_218,end);
        }
LAB_001641cb:
        if (iVar5 == 0x100) {
          local_218 = local_218 + 1;
        }
        else {
          if (iVar5 == 0x101) {
            bVar16 = true;
            bVar11 = false;
            goto LAB_00164226;
          }
          msg("ignoring trailing garbage at %s:%u",local_208,(ulong)local_20c);
          pcVar14 = local_218;
          do {
            buf = end;
            local_218 = end;
            if (pcVar14 == end) break;
            buf = pcVar14 + 1;
            cVar1 = *pcVar14;
            pcVar14 = buf;
            local_218 = buf;
          } while (cVar1 != '\n');
        }
        bVar11 = true;
LAB_00164223:
        bVar16 = false;
      }
LAB_00164226:
      if (!bVar11) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
          operator_delete(local_1c0._M_dataplus._M_p,
                          CONCAT71(local_1c0.field_2._M_allocated_capacity._1_7_,
                                   local_1c0.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
          operator_delete(local_1a0._M_dataplus._M_p,
                          CONCAT71(local_1a0.field_2._M_allocated_capacity._1_7_,
                                   local_1a0.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._M_dataplus._M_p != &local_180.field_2) {
          operator_delete(local_180._M_dataplus._M_p,
                          CONCAT71(local_180.field_2._M_allocated_capacity._1_7_,
                                   local_180.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != &local_160.field_2) {
          operator_delete(local_160._M_dataplus._M_p,
                          CONCAT71(local_160.field_2._M_allocated_capacity._1_7_,
                                   local_160.field_2._M_local_buf[0]) + 1);
        }
        return bVar16;
      }
      local_20c = local_20c + 1;
      iVar5 = skip_blank(&local_218,end);
      bVar11 = iVar5 == 0x101 || local_218 < end;
      buf = (char *)CONCAT71((int7)((ulong)buf >> 8),bVar11);
    } while (bVar11);
  }
  __assert_fail("p < end || c == IF_EOF",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ini_file.cxx"
                ,0x113,"bool xray_re::xr_ini_file::parse(const char *, const char *, const char *)")
  ;
}

Assistant:

bool xr_ini_file::parse(const char* p, const char* end, const char* path)
{
	std::string folder, fname, extension;
	xr_file_system::split_path(path, &folder, &fname, &extension);
	fname.append(extension);
	const char* file = fname.c_str();

	char temp[256];
	ini_section* section = 0;
	ini_item* item;
	std::string name;
	for (unsigned line = 1;; ++line) {
		int c = skip_blank(&p, end);
		xr_assert(p < end || c == IF_EOF);
		xr_assert(c != '\n' && c != '\r');
		if (c == '[') {
			++p;
			c = read_name(&p, end, sizeof(temp), temp);
			if (c != ']' || temp[0] == 0) {
				msg("bad section header at %s:%u", file, line);
				return false;
			}
			ini_section_vec_it it = lower_bound_if(m_sections.begin(), m_sections.end(), ini_section_pred(temp));
			if (it != m_sections.end() && xr_stricmp((*it)->name.c_str(), temp) == 0) {
				msg("duplicate section %s at %s:%u", temp, file, line);
				return false;
			}
			section = new ini_section(temp);
			m_sections.insert(it, section);
			++p;
			c = skip_blank(&p, end);
			if (c == ':') {
				for (;;) {
					++p;
					c = read_name(&p, end, sizeof(temp), temp);
					it = lower_bound_if(m_sections.begin(), m_sections.end(), ini_section_pred(temp));
					if (it == m_sections.end() || xr_stricmp((*it)->name.c_str(), temp) != 0) {
						msg("bad section reference '%s' at %s:%u", temp, file, line);
						break;
					}
					section->merge(*it);
					if (c != ',')
						break;
				}
			}
		} else if (c != IF_EOL && c != IF_EOF && is_name(c)) {
			if (section == 0) {
				msg("item without section at %s:%u", file, line);
				xr_not_expected();
			}
			c = read_item(&p, end, name, true);
			ini_item_vec_it it = lower_bound_if(section->begin(), section->end(), ini_item_pred(name.c_str()));
			if (it != section->end() && xr_stricmp((*it)->name.c_str(), name.c_str()) == 0) {
				item = *it;
			} else {
				item = new ini_item(name);
				section->items.insert(it, item);
			}
			if (c == '=') {
				++p;
				c = read_item(&p, end, item->value, false);
			} else {
				item->value.clear();
			}
		} else if (c == '#') {
			++p;
			c = read_name(&p, end, sizeof(temp), temp);
			if (c != '\"' || std::strcmp(temp, "include") != 0) {
				msg("bad directive %s at %s:%u", temp, file, line);
				return false;
			}
			++p;
			c = read_name(&p, end, sizeof(temp), temp);
			if (c != '\"' || temp[0] == 0) {
				msg("bad include at %s:%u", file, line);
				return false;
			}

			if (!load_include((folder + temp).c_str()))
				return false;

			++p;
			c = skip_blank(&p, end);
		}
		if (c == IF_EOF) {
			break;
		} else if (c != IF_EOL) {
			msg("ignoring trailing garbage at %s:%u", file, line);
			while (p != end) {
				if (*p++ == '\n')
					break;
			}
		} else {
			++p;
		}
	}
	return true;
}